

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageFlipHorizontal(Image *image)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  int iVar10;
  void *pvVar11;
  int x;
  ulong uVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    uVar3 = GetPixelDataSize(1,1,image->format);
    uVar1 = image->width;
    uVar2 = image->height;
    pvVar4 = malloc((long)(int)(uVar1 * uVar3 * uVar2));
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar3) {
      uVar6 = (ulong)uVar3;
    }
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    uVar14 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar14 = uVar5;
    }
    iVar8 = (uVar1 - 1) * uVar3;
    pvVar9 = pvVar4;
    for (; uVar5 != uVar14; uVar5 = uVar5 + 1) {
      pvVar11 = pvVar9;
      iVar10 = iVar8;
      for (uVar12 = 0; uVar12 != uVar7; uVar12 = uVar12 + 1) {
        for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
          *(undefined1 *)((long)pvVar11 + uVar13) =
               *(undefined1 *)((long)image->data + uVar13 + (long)iVar10);
        }
        pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar3);
        iVar10 = iVar10 - uVar3;
      }
      pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar1 * (long)(int)uVar3);
      iVar8 = iVar8 + uVar1 * uVar3;
    }
    free(image->data);
    image->data = pvVar4;
  }
  return;
}

Assistant:

void ImageFlipHorizontal(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *flippedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                // OPTION 1: Move pixels with memcopy()
                //memcpy(flippedData + (y*image->width + x)*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + (image->width - 1 - x))*bytesPerPixel, bytesPerPixel);

                // OPTION 2: Just copy data pixel by pixel
                for (int i = 0; i < bytesPerPixel; i++) flippedData[(y*image->width + x)*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + (image->width - 1 - x))*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = flippedData;

        /*
        // OPTION 3: Faster implementation (specific for 32bit pixels)
        // NOTE: It does not require additional allocations
        uint32_t *ptr = (uint32_t *)image->data;
        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width/2; x++)
            {
                uint32_t backup = ptr[y*image->width + x];
                ptr[y*image->width + x] = ptr[y*image->width + (image->width - 1 - x)];
                ptr[y*image->width + (image->width - 1 - x)] = backup;
            }
        }
        */
    }
}